

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O3

void Assimp::FindMeshCenterTransformed
               (aiMesh *mesh,aiVector3D *out,aiVector3D *min,aiVector3D *max,aiMatrix4x4 *m)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  FindAABBTransformed(mesh,min,max,m);
  fVar1 = max->z;
  fVar2 = min->z;
  uVar3 = max->x;
  uVar5 = max->y;
  uVar4 = min->x;
  uVar6 = min->y;
  out->x = ((float)uVar3 - (float)uVar4) * 0.5 + (float)uVar4;
  out->y = ((float)uVar5 - (float)uVar6) * 0.5 + (float)uVar6;
  out->z = (fVar1 - fVar2) * 0.5 + fVar2;
  return;
}

Assistant:

void FindMeshCenterTransformed (aiMesh* mesh, aiVector3D& out, aiVector3D& min,
    aiVector3D& max, const aiMatrix4x4& m)
{
    FindAABBTransformed(mesh,min,max,m);
    out = min + (max-min)*(ai_real)0.5;
}